

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependanceestimator.cxx
# Opt level: O1

int __thiscall DependanceEstimator::init(DependanceEstimator *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  uint uVar2;
  double **ppdVar3;
  int iVar4;
  void *in_RAX;
  void *pvVar5;
  void *extraout_RAX;
  long lVar6;
  long lVar7;
  bool bVar8;
  double dVar9;
  
  (this->super_Estimator).nSamples = 0;
  iVar1 = this->dependanceBins;
  lVar7 = (long)iVar1;
  if (0 < lVar7) {
    in_RAX = memset(this->aSamples,0,lVar7 * 8);
  }
  uVar2 = (this->super_Estimator).nEstimate;
  bVar8 = (uVar2 & 4) == 0;
  pvVar5 = (void *)CONCAT71((int7)((ulong)in_RAX >> 8),bVar8);
  if (0 < iVar1 && !bVar8) {
    pvVar5 = memset(this->aOne,0,lVar7 * 8);
  }
  bVar8 = (uVar2 & 8) == 0;
  pvVar5 = (void *)CONCAT71((int7)((ulong)pvVar5 >> 8),bVar8);
  if (0 < iVar1 && !bVar8) {
    pvVar5 = memset(this->aTwo,0,lVar7 * 8);
  }
  bVar8 = (uVar2 & 0x10) == 0;
  pvVar5 = (void *)CONCAT71((int7)((ulong)pvVar5 >> 8),bVar8);
  if (0 < iVar1 && !bVar8) {
    pvVar5 = memset(this->aThree,0,lVar7 * 8);
  }
  bVar8 = (uVar2 & 2) == 0;
  iVar4 = (int)CONCAT71((int7)((ulong)pvVar5 >> 8),bVar8);
  if (0 < iVar1 && !bVar8) {
    dVar9 = ceil((this->dDistEnd - this->dDistBegin) / this->dDistDelta);
    ppdVar3 = this->aDist;
    lVar6 = 0;
    pvVar5 = extraout_RAX;
    do {
      if (0 < (int)dVar9) {
        pvVar5 = memset(ppdVar3[lVar6],0,(ulong)(uint)(int)dVar9 * 8);
      }
      iVar4 = (int)pvVar5;
      lVar6 = lVar6 + 1;
    } while (lVar7 != lVar6);
  }
  return iVar4;
}

Assistant:

void DependanceEstimator::init()
{
	nSamples = 0;
	for(int i=0; i<dependanceBins; i++)
		aSamples[i] = 0.0;
	if(nEstimate & EST_MEAN)
		for(int i=0; i<dependanceBins; i++)
			aOne[i] = 0.0;
	if(nEstimate & EST_VAR)
		for(int i=0; i<dependanceBins; i++)
			aTwo[i] = 0.0;
	if(nEstimate & EST_CUR)
		for(int i=0; i<dependanceBins; i++)
			aThree[i] = 0.0;
	if(nEstimate & EST_DENS) {
		int distBins = int(ceil((dDistEnd - dDistBegin) / dDistDelta));
		for( int i=0; i<dependanceBins; i++ )
			for( int j=0; j<distBins; j++ )
				aDist[i][j] = 0.0;
	}
}